

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.cpp
# Opt level: O3

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>_>_>
* fineftp::Filesystem::dirContent
            (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>_>_>
             *__return_storage_ptr__,string *path)

{
  _Rb_tree_header *p_Var1;
  long *plVar2;
  pointer pcVar3;
  int iVar4;
  dirent *pdVar5;
  size_t sVar6;
  undefined8 *puVar7;
  int *piVar8;
  char *pcVar9;
  ulong uVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ulong *local_170;
  long local_168;
  ulong local_160 [2];
  long *local_150;
  long local_148;
  long local_140;
  undefined4 uStack_138;
  undefined4 uStack_134;
  ulong *local_130;
  long local_128;
  ulong local_120 [2];
  DIR *local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  FileStatus local_e8;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_110 = opendir((path->_M_dataplus)._M_p);
  if (local_110 == (DIR *)0x0) {
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&::std::cerr,"Error opening directory: ",0x19);
    piVar8 = __errno_location();
    pcVar9 = strerror(*piVar8);
    if (pcVar9 == (char *)0x0) {
      ::std::ios::clear((int)*(undefined8 *)(::std::cerr + -0x18) + 0x14d6d8);
    }
    else {
      sVar6 = strlen(pcVar9);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&::std::cerr,pcVar9,sVar6);
    }
    ::std::ios::widen((char)*(undefined8 *)(::std::cerr + -0x18) + -0x28);
    ::std::ostream::put(-0x28);
    ::std::ostream::flush();
  }
  else {
    while( true ) {
      pdVar5 = readdir(local_110);
      if (pdVar5 == (dirent *)0x0) break;
      pcVar9 = pdVar5->d_name;
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      sVar6 = strlen(pcVar9);
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_108,pcVar9,pdVar5->d_name + sVar6);
      local_170 = local_160;
      pcVar3 = (path->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_170,pcVar3,pcVar3 + path->_M_string_length);
      ::std::__cxx11::string::append((char *)&local_170);
      local_130 = local_120;
      sVar6 = strlen(pcVar9);
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,pcVar9,pcVar9 + sVar6);
      uVar10 = 0xf;
      if (local_170 != local_160) {
        uVar10 = local_160[0];
      }
      if (uVar10 < (ulong)(local_128 + local_168)) {
        uVar10 = 0xf;
        if (local_130 != local_120) {
          uVar10 = local_120[0];
        }
        if (uVar10 < (ulong)(local_128 + local_168)) goto LAB_001274a3;
        puVar7 = (undefined8 *)
                 ::std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,(ulong)local_170);
      }
      else {
LAB_001274a3:
        puVar7 = (undefined8 *)
                 ::std::__cxx11::string::_M_append((char *)&local_170,(ulong)local_130);
      }
      plVar2 = puVar7 + 2;
      if ((long *)*puVar7 == plVar2) {
        local_140 = *plVar2;
        uStack_138 = *(undefined4 *)(puVar7 + 3);
        uStack_134 = *(undefined4 *)((long)puVar7 + 0x1c);
        local_150 = &local_140;
      }
      else {
        local_140 = *plVar2;
        local_150 = (long *)*puVar7;
      }
      local_148 = puVar7[1];
      *puVar7 = plVar2;
      puVar7[1] = 0;
      *(undefined1 *)plVar2 = 0;
      local_e8.path_._M_dataplus._M_p = (pointer)&local_e8.path_.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e8,local_150,(undefined1 *)(local_148 + (long)local_150));
      iVar4 = stat((char *)local_150,(stat *)&local_e8.file_status_);
      local_e8.is_ok_ = iVar4 == 0;
      ::std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,fineftp::Filesystem::FileStatus>,std::_Select1st<std::pair<std::__cxx11::string_const,fineftp::Filesystem::FileStatus>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,fineftp::Filesystem::FileStatus>>>
      ::_M_emplace_unique<std::__cxx11::string,fineftp::Filesystem::FileStatus>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,fineftp::Filesystem::FileStatus>,std::_Select1st<std::pair<std::__cxx11::string_const,fineftp::Filesystem::FileStatus>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,fineftp::Filesystem::FileStatus>>>
                  *)__return_storage_ptr__,&local_108,&local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8.path_._M_dataplus._M_p != &local_e8.path_.field_2) {
        operator_delete(local_e8.path_._M_dataplus._M_p,
                        local_e8.path_.field_2._M_allocated_capacity + 1);
      }
      if (local_150 != &local_140) {
        operator_delete(local_150,local_140 + 1);
      }
      if (local_130 != local_120) {
        operator_delete(local_130,local_120[0] + 1);
      }
      if (local_170 != local_160) {
        operator_delete(local_170,local_160[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
    }
    closedir(local_110);
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<std::string, FileStatus> dirContent(const std::string& path)
  {
    std::map<std::string, FileStatus> content;
#ifdef WIN32
    std::string find_file_path = path + "\\*";
    std::replace(find_file_path.begin(), find_file_path.end(), '/', '\\');

    std::wstring w_find_file_path = StrConvert::Utf8ToWide(find_file_path);

    HANDLE hFind;
    WIN32_FIND_DATAW ffd;
    hFind = FindFirstFileW(w_find_file_path.c_str(), &ffd);
    if (hFind == INVALID_HANDLE_VALUE)
    {
      std::cerr << "FindFirstFile Error" << std::endl;
      return content;
    }

    do
    {
      std::string file_name = StrConvert::WideToUtf8(std::wstring(ffd.cFileName));
      content.emplace(file_name, FileStatus(path + "\\" + file_name));
    } while (FindNextFileW(hFind, &ffd) != 0);
    FindClose(hFind);
#else // WIN32
    DIR *dp;
    struct dirent *dirp;
    if((dp = opendir(path.c_str())) == NULL)
    {
        std::cerr << "Error opening directory: " << strerror(errno) << std::endl;
        return content;
    }

    while ((dirp = readdir(dp)) != NULL)
    {
      content.emplace(std::string(dirp->d_name), FileStatus(path + "/" + std::string(dirp->d_name)));
    }
    closedir(dp);

#endif // WIN32
    return content;
  }